

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O0

pair<helics::GlobalFederateId,_TimeRepresentation<count_time<9,_long>_>_> __thiscall
helics::TimeCoordinator::getMinGrantedDependency(TimeCoordinator *this)

{
  bool bVar1;
  reference this_00;
  __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  *in_RDI;
  pair<helics::GlobalFederateId,_TimeRepresentation<count_time<9,_long>_>_> pVar2;
  DependencyInfo *dep;
  const_iterator __end1;
  const_iterator __begin1;
  TimeDependencies *__range1;
  GlobalFederateId minID;
  Time minTime;
  TimeDependencies *in_stack_ffffffffffffffa8;
  __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  local_38;
  __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  *local_30;
  GlobalFederateId local_24;
  TimeRepresentation<count_time<9,_long>_> local_20 [2];
  pair<helics::GlobalFederateId,_TimeRepresentation<count_time<9,_long>_>_> local_10;
  
  local_20[0].internalTimeCode = 0x7fffffffffffffff;
  GlobalFederateId::GlobalFederateId(&local_24);
  local_30 = in_RDI + 1;
  local_38._M_current = (DependencyInfo *)TimeDependencies::begin(in_stack_ffffffffffffffa8);
  TimeDependencies::end(in_stack_ffffffffffffffa8);
  while (bVar1 = __gnu_cxx::
                 operator==<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                           (in_RDI,(__normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                                    *)in_stack_ffffffffffffffa8), ((bVar1 ^ 0xffU) & 1) != 0) {
    this_00 = __gnu_cxx::
              __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
              ::operator*(&local_38);
    if ((((this_00->dependency & 1U) != 0) &&
        ((this_00->super_TimeData).mTimeState != time_requested)) &&
       (bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<
                          ((TimeRepresentation<count_time<9,_long>_> *)this_00,local_20), bVar1)) {
      local_20[0].internalTimeCode = (this_00->super_TimeData).next.internalTimeCode;
      local_24.gid = (this_00->fedID).gid;
    }
    __gnu_cxx::
    __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
    ::operator++(&local_38);
  }
  std::pair<helics::GlobalFederateId,_TimeRepresentation<count_time<9,_long>_>_>::
  pair<helics::GlobalFederateId_&,_TimeRepresentation<count_time<9,_long>_>_&,_true>
            (&local_10,&local_24,local_20);
  pVar2._4_4_ = 0;
  pVar2.first.gid = local_10.first.gid;
  pVar2.second.internalTimeCode = local_10.second.internalTimeCode;
  return pVar2;
}

Assistant:

std::pair<GlobalFederateId, Time> TimeCoordinator::getMinGrantedDependency() const
{
    Time minTime = Time::maxVal();
    GlobalFederateId minID;
    for (const auto& dep : dependencies) {
        if (!dep.dependency) {
            continue;
        }
        if (dep.mTimeState != TimeState::time_requested) {
            if (dep.next < minTime) {
                minTime = dep.next;
                minID = dep.fedID;
            }
        }
    }
    return {minID, minTime};
}